

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  float fVar4;
  ImGuiWindow *window;
  int i;
  bool is_elapsed;
  bool is_delivered;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdc;
  byte in_stack_ffffffffffffffdd;
  byte in_stack_ffffffffffffffde;
  undefined1 uVar5;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  int i_00;
  undefined2 in_stack_ffffffffffffffec;
  byte in_stack_ffffffffffffffee;
  byte in_stack_ffffffffffffffef;
  ImVec2 in_stack_fffffffffffffff0;
  
  pIVar1 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    uVar5 = false;
    if ((GImGui->IO).ImeSetInputScreenPosFn != (_func_void_int_int *)0x0) {
      in_stack_fffffffffffffff0 =
           operator-((ImVec2 *)
                     (ulong)CONCAT16(in_stack_ffffffffffffffde,
                                     CONCAT15(in_stack_ffffffffffffffdd,
                                              CONCAT14(in_stack_ffffffffffffffdc,
                                                       in_stack_ffffffffffffffd8))),
                     (ImVec2 *)0x146cfd);
      fVar4 = ImLengthSqr((ImVec2 *)&stack0xfffffffffffffff0);
      uVar5 = 0.0001 < fVar4;
    }
    if ((bool)uVar5 != false) {
      (*(pIVar1->IO).ImeSetInputScreenPosFn)
                ((int)(pIVar1->PlatformImePos).x,(int)(pIVar1->PlatformImePos).y);
      pIVar1->PlatformImeLastPos = pIVar1->PlatformImePos;
    }
    if (((pIVar1->CurrentWindowStack).Size != 1) && (1 < (pIVar1->CurrentWindowStack).Size)) {
      while (1 < (pIVar1->CurrentWindowStack).Size) {
        End();
      }
    }
    pIVar1->FrameScopePushedImplicitWindow = false;
    if ((pIVar1->CurrentWindow != (ImGuiWindow *)0x0) &&
       ((pIVar1->CurrentWindow->WriteAccessed & 1U) == 0)) {
      pIVar1->CurrentWindow->Active = false;
    }
    End();
    if (pIVar1->NavWindowingTarget != (ImGuiWindow *)0x0) {
      NavUpdateWindowingList();
    }
    if ((pIVar1->DragDropActive & 1U) != 0) {
      in_stack_ffffffffffffffef = (pIVar1->DragDropPayload).Delivery & 1;
      in_stack_ffffffffffffffde = 0;
      if (((pIVar1->DragDropPayload).DataFrameCount + 1 < pIVar1->FrameCount) &&
         (in_stack_ffffffffffffffdd = 1, in_stack_ffffffffffffffde = in_stack_ffffffffffffffdd,
         (pIVar1->DragDropSourceFlags & 0x20U) == 0)) {
        bVar2 = IsMouseDown(pIVar1->DragDropMouseButton);
        in_stack_ffffffffffffffdd = bVar2 ^ 0xff;
        in_stack_ffffffffffffffde = in_stack_ffffffffffffffdd;
      }
      in_stack_ffffffffffffffee = in_stack_ffffffffffffffde & 1;
      if (((in_stack_ffffffffffffffef & 1) != 0) || (in_stack_ffffffffffffffee != 0)) {
        ClearDragDrop();
      }
    }
    if (((pIVar1->DragDropActive & 1U) != 0) &&
       (pIVar1->DragDropSourceFrameCount < pIVar1->FrameCount)) {
      pIVar1->DragDropWithinSourceOrTarget = true;
      SetTooltip("...");
      pIVar1->DragDropWithinSourceOrTarget = false;
    }
    pIVar1->FrameScopeActive = false;
    pIVar1->FrameCountEnded = pIVar1->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    ImVector<ImGuiWindow_*>::resize
              ((ImVector<ImGuiWindow_*> *)in_stack_ffffffffffffffe0,
               CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffde,
                                       CONCAT11(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffdc)
                                      )));
    ImVector<ImGuiWindow_*>::reserve
              ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffff0,
               CONCAT13(in_stack_ffffffffffffffef,
                        CONCAT12(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec)));
    for (i_00 = 0; i_00 != (pIVar1->Windows).Size; i_00 = i_00 + 1) {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->Windows,i_00);
      in_stack_ffffffffffffffe0 = *ppIVar3;
      if (((in_stack_ffffffffffffffe0->Active & 1U) == 0) ||
         ((in_stack_ffffffffffffffe0->Flags & 0x1000000U) == 0)) {
        AddWindowToSortBuffer
                  ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffff0,
                   (ImGuiWindow *)
                   CONCAT17(in_stack_ffffffffffffffef,
                            CONCAT16(in_stack_ffffffffffffffee,
                                     CONCAT24(in_stack_ffffffffffffffec,i_00))));
      }
    }
    ImVector<ImGuiWindow_*>::swap(&pIVar1->Windows,&pIVar1->WindowsSortBuffer);
    (pIVar1->IO).MetricsActiveWindows = pIVar1->WindowsActiveCount;
    ((pIVar1->IO).Fonts)->Locked = false;
    (pIVar1->IO).MouseWheelH = 0.0;
    (pIVar1->IO).MouseWheel = 0.0;
    ImVector<unsigned_short>::resize
              ((ImVector<unsigned_short> *)in_stack_ffffffffffffffe0,
               CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffffde,
                                       CONCAT11(in_stack_ffffffffffffffdd,in_stack_ffffffffffffffdc)
                                      )));
    memset((pIVar1->IO).NavInputs,0,0x54);
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.FrameScopeActive && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Report when there is a mismatch of Begin/BeginChild vs End/EndChild calls. Important: Remember that the Begin/BeginChild API requires you
    // to always call End/EndChild even if Begin/BeginChild returns false! (this is unfortunately inconsistent with most other Begin* API).
    if (g.CurrentWindowStack.Size != 1)
    {
        if (g.CurrentWindowStack.Size > 1)
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?");
            while (g.CurrentWindowStack.Size > 1) // FIXME-ERRORHANDLING
                End();
        }
        else
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?");
        }
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.FrameScopePushedImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget)
        NavUpdateWindowingList();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.FrameScopeActive = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}